

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O2

fvar<double,_2UL> * __thiscall
ising::free_energy::square::
finite<unsigned_int,double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
          (fvar<double,_2UL> *__return_storage_ptr__,square *this,uint Lx,uint Ly,double Jx,
          double Jy,fvar<double,_2UL> beta)

{
  invalid_argument *this_00;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  fvar<double,_2UL> *cr;
  fvar<double,_2UL> *cr_00;
  fvar<double,_2UL> *cr_01;
  fvar<double,_2UL> *cr_02;
  fvar<double,_2UL> *cr_03;
  fvar<double,_2UL> *cr_04;
  fvar<double,_2UL> *cr_05;
  fvar<double,_2UL> *cr_06;
  fvar<double,_2UL> *cr_07;
  fvar<double,_2UL> *cr_08;
  fvar<double,_2UL> *cr_09;
  fvar<double,_2UL> *cr_10;
  fvar<double,_2UL> *cr_11;
  fvar<double,_2UL> *cr_12;
  fvar<double,_2UL> *cr_13;
  fvar<double,_2UL> *cr_14;
  fvar<double,_2UL> *cr_15;
  fvar<double,_2UL> *cr_16;
  fvar<double,_2UL> *cr_17;
  fvar<double,_2UL> *cr_18;
  fvar<double,_2UL> *cr_19;
  fvar<double,_2UL> *cr_20;
  fvar<double,_2UL> *cr_21;
  fvar<double,_2UL> *extraout_RDX;
  fvar<double,_2UL> *cr_22;
  fvar<double,_2UL> *cr_23;
  fvar<double,_2UL> *cr_24;
  fvar<double,_2UL> *extraout_RDX_00;
  fvar<double,_2UL> *pfVar1;
  fvar<double,_2UL> *cr_25;
  fvar<double,_2UL> *cr_26;
  fvar<double,_2UL> *cr_27;
  fvar<double,2ul> *this_01;
  uint uVar2;
  double dVar3;
  fvar<double,_2UL> retval_8;
  fvar<double,_2UL> retval_2;
  undefined1 local_290 [8];
  fvar<double,_2UL> gamma;
  fvar<double,_2UL> retval_15;
  fvar<double,_2UL> retval_4;
  fvar<double,_2UL> retval_13;
  fvar<double,_2UL> retval_5;
  fvar<double,_2UL> retval_10;
  fvar<double,_2UL> local_1d0;
  fvar<double,_2UL> retval_35;
  double local_1a0;
  root_type local_198 [3];
  uint local_17c;
  fvar<double,_2UL> a;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> logZ;
  root_type local_130;
  root_type local_128;
  double local_120;
  double Jy_local;
  double Jx_local;
  fvar<double,_2UL> retval_3;
  fvar<double,_2UL> local_e8;
  fvar<double,_2UL> local_c8;
  fvar<double,_2UL> local_a8;
  fvar<double,_2UL> b;
  fvar<double,_2UL> local_68;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> gamma0;
  
  Jy_local = Jy;
  Jx_local = Jx;
  if (((int)this == 0) || (Lx == 0)) {
    this_00 = (invalid_argument *)
              __cxa_allocate_exception
                        (0x10,this,CONCAT44(in_register_00000014,Lx),
                         CONCAT44(in_register_0000000c,Ly));
    std::invalid_argument::invalid_argument(this_00,"Lx and Ly should be positive");
LAB_0010e326:
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((Jx <= 0.0) || (Jy <= 0.0)) {
    this_00 = (invalid_argument *)
              __cxa_allocate_exception
                        (0x10,this,CONCAT44(in_register_00000014,Lx),
                         CONCAT44(in_register_0000000c,Ly));
    std::invalid_argument::invalid_argument(this_00,"Jx and Jy should be positive");
    goto LAB_0010e326;
  }
  a.v._M_elems[2] = beta.v._M_elems[2];
  a.v._M_elems[0] = beta.v._M_elems[0];
  a.v._M_elems[1] = beta.v._M_elems[1];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=(&a,&Jx_local);
  b.v._M_elems[2] = beta.v._M_elems[2];
  b.v._M_elems[0] = beta.v._M_elems[0];
  b.v._M_elems[1] = beta.v._M_elems[1];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=(&b,&Jy_local);
  local_a8.v._M_elems[2] = 0.0;
  local_c8.v._M_elems[2] = 0.0;
  local_a8.v._M_elems[0] = 0.0;
  local_a8.v._M_elems[1] = 0.0;
  local_c8.v._M_elems[0] = 0.0;
  local_c8.v._M_elems[1] = 0.0;
  local_e8.v._M_elems[0] = 0.0;
  local_e8.v._M_elems[1] = 0.0;
  local_e8.v._M_elems[2] = 0.0;
  local_68.v._M_elems[0] = 0.0;
  local_68.v._M_elems[1] = 0.0;
  local_68.v._M_elems[2] = 0.0;
  retval_15.v._M_elems[0] = 2.0;
  retval_2.v._M_elems[0] = a.v._M_elems[0];
  retval_2.v._M_elems[1] = a.v._M_elems[1];
  retval_2.v._M_elems[2] = a.v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (&retval_2,(root_type *)&retval_15);
  boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>
            (&retval_13,(detail *)&retval_2,cr);
  retval_3.v._M_elems[1] = retval_13.v._M_elems[1];
  retval_3.v._M_elems[2] = retval_13.v._M_elems[2];
  retval_3.v._M_elems[0] = retval_13.v._M_elems[0] + 1.0;
  retval_8.v._M_elems[0] = 2.0;
  retval_4.v._M_elems[0] = a.v._M_elems[0];
  retval_4.v._M_elems[1] = a.v._M_elems[1];
  retval_4.v._M_elems[2] = a.v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (&retval_4,(root_type *)&retval_8);
  boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>
            (&retval_35,(detail *)&retval_4,cr_00);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator/
            ((promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *)&gamma,(fvar<double,2ul> *)&retval_3,
             &retval_35);
  boost::math::differentiation::autodiff_v1::detail::log<double,2ul>(&logZ,(detail *)&gamma,cr_01);
  local_1d0.v._M_elems[0] = 2.0;
  retval_5.v._M_elems[0] = b.v._M_elems[0];
  retval_5.v._M_elems[1] = b.v._M_elems[1];
  retval_5.v._M_elems[2] = b.v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (&retval_5,(root_type *)&local_1d0);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-(&logZ,&retval_5);
  local_17c = Lx * 2;
  dVar3 = (double)((ulong)this & 0xffffffff);
  local_1a0 = 0.0;
  for (uVar2 = 0; local_17c != uVar2; uVar2 = uVar2 + 1) {
    local_198[0] = 2.0;
    retval_2.v._M_elems[0] = a.v._M_elems[0];
    retval_2.v._M_elems[1] = a.v._M_elems[1];
    retval_2.v._M_elems[2] = a.v._M_elems[2];
    boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
              (&retval_2,local_198);
    boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>
              (&retval_13,(detail *)&retval_2,cr_02);
    local_290 = (undefined1  [8])0x4000000000000000;
    retval_4.v._M_elems[0] = b.v._M_elems[0];
    retval_4.v._M_elems[1] = b.v._M_elems[1];
    retval_4.v._M_elems[2] = b.v._M_elems[2];
    boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
              (&retval_4,(root_type *)local_290);
    boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>
              (&retval_35,(detail *)&retval_4,cr_03);
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator*
              ((promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *)&retval_3,
               (fvar<double,2ul> *)&retval_13,&retval_35);
    local_120 = cos((local_1a0 * 3.141592653589793) / (double)Lx);
    local_128 = 2.0;
    retval_8.v._M_elems[0] = b.v._M_elems[0];
    retval_8.v._M_elems[1] = b.v._M_elems[1];
    retval_8.v._M_elems[2] = b.v._M_elems[2];
    boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
              (&retval_8,&local_128);
    boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>
              (&retval_15,(detail *)&retval_8,cr_04);
    retval_5.v._M_elems[2] = retval_15.v._M_elems[2];
    retval_5.v._M_elems[0] = retval_15.v._M_elems[0];
    retval_5.v._M_elems[1] = retval_15.v._M_elems[1];
    boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
              (&retval_5,&local_120);
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
              (&retval_3,&retval_5);
    local_130 = 2.0;
    retval_10.v._M_elems[0] = a.v._M_elems[0];
    retval_10.v._M_elems[1] = a.v._M_elems[1];
    retval_10.v._M_elems[2] = a.v._M_elems[2];
    boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
              (&retval_10,&local_130);
    boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>
              (&local_1d0,(detail *)&retval_10,cr_05);
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator/
              (&logZ,(fvar<double,2ul> *)&gamma,&local_1d0);
    if (uVar2 == 0) {
      boost::math::differentiation::autodiff_v1::detail::fabs<double,2ul>
                (&gamma,(detail *)&gamma0,cr_06);
LAB_0010db90:
      retval_2.v._M_elems[0] = gamma.v._M_elems[0];
      retval_2.v._M_elems[1] = gamma.v._M_elems[1];
      retval_2.v._M_elems[2] = gamma.v._M_elems[2];
      local_1d0.v._M_elems[0] = dVar3;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval_2,(root_type *)&local_1d0);
      retval_10.v._M_elems[0] = 2.0;
      retval_13.v._M_elems[0] = retval_2.v._M_elems[0];
      retval_13.v._M_elems[1] = retval_2.v._M_elems[1];
      retval_13.v._M_elems[2] = retval_2.v._M_elems[2];
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator/=
                (&retval_13,(root_type *)&retval_10);
      retval_8.v._M_elems[0] = gamma.v._M_elems[0];
      retval_8.v._M_elems[1] = gamma.v._M_elems[1];
      retval_8.v._M_elems[2] = gamma.v._M_elems[2];
      local_198[0] = dVar3;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval_8,local_198);
      retval_15.v._M_elems[0] = retval_8.v._M_elems[0];
      retval_15.v._M_elems[1] = retval_8.v._M_elems[1];
      retval_15.v._M_elems[2] = retval_8.v._M_elems[2];
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::negate(&retval_15);
      boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
                (&retval_5,(detail *)&retval_15,cr_13);
      retval_4.v._M_elems[1] = retval_5.v._M_elems[1];
      retval_4.v._M_elems[2] = retval_5.v._M_elems[2];
      retval_4.v._M_elems[0] = retval_5.v._M_elems[0] + 1.0;
      boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                (&retval_35,(detail *)&retval_4,cr_14);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                (&retval_13,&retval_35);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                ((fvar<double,2ul> *)&local_e8,&retval_3);
      retval_2.v._M_elems[0] = gamma.v._M_elems[0];
      retval_2.v._M_elems[1] = gamma.v._M_elems[1];
      retval_2.v._M_elems[2] = gamma.v._M_elems[2];
      local_1d0.v._M_elems[0] = dVar3;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval_2,(root_type *)&local_1d0);
      retval_10.v._M_elems[0] = 2.0;
      retval_13.v._M_elems[0] = retval_2.v._M_elems[0];
      retval_13.v._M_elems[1] = retval_2.v._M_elems[1];
      retval_13.v._M_elems[2] = retval_2.v._M_elems[2];
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator/=
                (&retval_13,(root_type *)&retval_10);
      local_198[0] = 1.0;
      retval_8.v._M_elems[0] = gamma.v._M_elems[0];
      retval_8.v._M_elems[1] = gamma.v._M_elems[1];
      retval_8.v._M_elems[2] = gamma.v._M_elems[2];
      local_290 = (undefined1  [8])dVar3;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval_8,(root_type *)local_290);
      retval_15.v._M_elems[0] = retval_8.v._M_elems[0];
      retval_15.v._M_elems[1] = retval_8.v._M_elems[1];
      retval_15.v._M_elems[2] = retval_8.v._M_elems[2];
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::negate(&retval_15);
      boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
                (&retval_5,(detail *)&retval_15,cr_15);
      boost::math::differentiation::autodiff_v1::detail::operator-(&retval_4,local_198,&retval_5);
      boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                (&retval_35,(detail *)&retval_4,cr_16);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                (&retval_13,&retval_35);
      this_01 = (fvar<double,2ul> *)&local_68;
    }
    else {
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator*
                (&retval_35,(fvar<double,2ul> *)&logZ,(fvar<double,_2UL> *)&logZ);
      retval_2.v._M_elems[1] = retval_35.v._M_elems[1];
      retval_2.v._M_elems[2] = retval_35.v._M_elems[2];
      retval_2.v._M_elems[0] = retval_35.v._M_elems[0] + -1.0;
      boost::math::differentiation::autodiff_v1::detail::sqrt<double,2ul>
                (&retval_13,(detail *)&retval_2,cr_07);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                ((fvar<double,_2UL> *)&logZ,&retval_13);
      boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                (&gamma,(detail *)&retval_3,cr_08);
      if ((uVar2 & 1) == 0) goto LAB_0010db90;
      retval_2.v._M_elems[0] = gamma.v._M_elems[0];
      retval_2.v._M_elems[1] = gamma.v._M_elems[1];
      retval_2.v._M_elems[2] = gamma.v._M_elems[2];
      local_1d0.v._M_elems[0] = dVar3;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval_2,(root_type *)&local_1d0);
      retval_10.v._M_elems[0] = 2.0;
      retval_13.v._M_elems[0] = retval_2.v._M_elems[0];
      retval_13.v._M_elems[1] = retval_2.v._M_elems[1];
      retval_13.v._M_elems[2] = retval_2.v._M_elems[2];
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator/=
                (&retval_13,(root_type *)&retval_10);
      retval_8.v._M_elems[0] = gamma.v._M_elems[0];
      retval_8.v._M_elems[1] = gamma.v._M_elems[1];
      retval_8.v._M_elems[2] = gamma.v._M_elems[2];
      local_198[0] = dVar3;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval_8,local_198);
      retval_15.v._M_elems[0] = retval_8.v._M_elems[0];
      retval_15.v._M_elems[1] = retval_8.v._M_elems[1];
      retval_15.v._M_elems[2] = retval_8.v._M_elems[2];
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::negate(&retval_15);
      boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
                (&retval_5,(detail *)&retval_15,cr_09);
      retval_4.v._M_elems[1] = retval_5.v._M_elems[1];
      retval_4.v._M_elems[2] = retval_5.v._M_elems[2];
      retval_4.v._M_elems[0] = retval_5.v._M_elems[0] + 1.0;
      boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                (&retval_35,(detail *)&retval_4,cr_10);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                (&retval_13,&retval_35);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
                ((fvar<double,2ul> *)&local_a8,&retval_3);
      retval_2.v._M_elems[0] = gamma.v._M_elems[0];
      retval_2.v._M_elems[1] = gamma.v._M_elems[1];
      retval_2.v._M_elems[2] = gamma.v._M_elems[2];
      local_1d0.v._M_elems[0] = dVar3;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval_2,(root_type *)&local_1d0);
      retval_10.v._M_elems[0] = 2.0;
      retval_13.v._M_elems[0] = retval_2.v._M_elems[0];
      retval_13.v._M_elems[1] = retval_2.v._M_elems[1];
      retval_13.v._M_elems[2] = retval_2.v._M_elems[2];
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator/=
                (&retval_13,(root_type *)&retval_10);
      local_198[0] = 1.0;
      retval_8.v._M_elems[0] = gamma.v._M_elems[0];
      retval_8.v._M_elems[1] = gamma.v._M_elems[1];
      retval_8.v._M_elems[2] = gamma.v._M_elems[2];
      local_290 = (undefined1  [8])dVar3;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
                (&retval_8,(root_type *)local_290);
      retval_15.v._M_elems[0] = retval_8.v._M_elems[0];
      retval_15.v._M_elems[1] = retval_8.v._M_elems[1];
      retval_15.v._M_elems[2] = retval_8.v._M_elems[2];
      boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::negate(&retval_15);
      boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
                (&retval_5,(detail *)&retval_15,cr_11);
      boost::math::differentiation::autodiff_v1::detail::operator-(&retval_4,local_198,&retval_5);
      boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                (&retval_35,(detail *)&retval_4,cr_12);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                (&retval_13,&retval_35);
      this_01 = (fvar<double,2ul> *)&local_c8;
    }
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
              (this_01,&retval_3);
    local_1a0 = local_1a0 + 1.0;
  }
  dVar3 = (double)(Lx * (int)this);
  gamma.v._M_elems[1] = a.v._M_elems[1];
  gamma.v._M_elems[2] = a.v._M_elems[2];
  gamma.v._M_elems[0] = -0.6931471805599453 / dVar3 + a.v._M_elems[0];
  retval_5.v._M_elems[0] = 0.5;
  retval_15.v._M_elems[0] = 1.0;
  retval_8.v._M_elems[0] = -4.0;
  retval_4.v._M_elems[0] = a.v._M_elems[0];
  retval_4.v._M_elems[1] = a.v._M_elems[1];
  retval_4.v._M_elems[2] = a.v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (&retval_4,(root_type *)&retval_8);
  boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
            (&retval_35,(detail *)&retval_4,cr_17);
  boost::math::differentiation::autodiff_v1::detail::operator-
            (&retval_2,(root_type *)&retval_15,&retval_35);
  boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
            (&retval_13,(detail *)&retval_2,cr_18);
  retval_3.v._M_elems[2] = retval_13.v._M_elems[2];
  retval_3.v._M_elems[0] = retval_13.v._M_elems[0];
  retval_3.v._M_elems[1] = retval_13.v._M_elems[1];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (&retval_3,(root_type *)&retval_5);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+(&gamma,&retval_3);
  if (gamma0.v._M_elems[0] <= 0.0) {
    if (0.0 <= gamma0.v._M_elems[0]) {
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
                (&local_c8,&local_a8);
      boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
                (&retval_4,(detail *)&retval_5,cr_25);
      retval_35.v._M_elems[1] = retval_4.v._M_elems[1];
      retval_35.v._M_elems[2] = retval_4.v._M_elems[2];
      retval_35.v._M_elems[0] = retval_4.v._M_elems[0] + 1.0;
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
                (&local_e8,&local_a8);
      boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
                (&retval_15,(detail *)&retval_8,cr_26);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                (&retval_35,&retval_15);
      boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
                (&retval_13,(detail *)&retval_2,cr_27);
      boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
                (&local_a8,&retval_13);
      pfVar1 = &local_1d0;
      local_1d0.v._M_elems[0] = dVar3;
      goto LAB_0010e280;
    }
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
              (&local_c8,&local_a8);
    boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
              (&retval_5,(detail *)&retval_15,cr_22);
    retval_4.v._M_elems[1] = retval_5.v._M_elems[1];
    retval_4.v._M_elems[2] = retval_5.v._M_elems[2];
    retval_4.v._M_elems[0] = retval_5.v._M_elems[0] + 1.0;
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
              (&local_e8,&local_a8);
    boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
              (&retval_8,(detail *)&local_1d0,cr_23);
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
              (&retval_4,&retval_8);
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
              (&local_68,&local_a8);
    boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
              (&retval_10,(detail *)local_198,cr_24);
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
              (&retval_35,&retval_10);
    pfVar1 = extraout_RDX_00;
  }
  else {
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
              (&local_c8,&local_a8);
    boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
              (&retval_5,(detail *)&retval_15,cr_19);
    retval_4.v._M_elems[1] = retval_5.v._M_elems[1];
    retval_4.v._M_elems[2] = retval_5.v._M_elems[2];
    retval_4.v._M_elems[0] = retval_5.v._M_elems[0] + 1.0;
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
              (&local_e8,&local_a8);
    boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
              (&retval_8,(detail *)&local_1d0,cr_20);
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
              (&retval_4,&retval_8);
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
              (&local_68,&local_a8);
    boost::math::differentiation::autodiff_v1::detail::exp<double,2ul>
              (&retval_10,(detail *)local_198,cr_21);
    boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator-
              (&retval_35,&retval_10);
    pfVar1 = extraout_RDX;
  }
  boost::math::differentiation::autodiff_v1::detail::log<double,2ul>
            (&retval_13,(detail *)&retval_2,pfVar1);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
            (&local_a8,&retval_13);
  pfVar1 = (fvar<double,_2UL> *)local_290;
  local_290 = (undefined1  [8])dVar3;
LAB_0010e280:
  gamma.v._M_elems[2] = retval_3.v._M_elems[2];
  gamma.v._M_elems[0] = retval_3.v._M_elems[0];
  gamma.v._M_elems[1] = retval_3.v._M_elems[1];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator/=
            (&gamma,(root_type *)pfVar1);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+=
            ((fvar<double,2ul> *)&logZ,&gamma);
  gamma.v._M_elems[2] = logZ.v._M_elems[2];
  gamma.v._M_elems[0] = logZ.v._M_elems[0];
  gamma.v._M_elems[1] = logZ.v._M_elems[1];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::negate(&gamma);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator/
            (__return_storage_ptr__,(fvar<double,2ul> *)&gamma,&beta);
  return __return_storage_ptr__;
}

Assistant:

inline U finite(I Lx, I Ly, T Jx, T Jy, U beta) {
  typedef I int_t;
  typedef T real_t;
  typedef U value_t;
  if (Lx <= 0 || Ly <= 0)
    throw(std::invalid_argument("Lx and Ly should be positive"));
  if (Jx <= 0 || Jy <= 0)
    throw(std::invalid_argument("Jx and Jy should be positive"));
  real_t pi = boost::math::constants::pi<real_t>();
  auto a = beta * Jx;
  auto b = beta * Jy;
  value_t lp0(0), lp1(0), lp2(0), lp3(0);
  auto gamma0 = log((1 + cosh(2 * a)) / sinh(2 * a)) - 2 * b;
  for (int_t k = 0; k < 2 * Ly; ++k) {
    auto cosh_g = (cosh(2 * a) * cosh(2 * b) - cos(pi * k / Ly) * sinh(2 * b)) /
                  sinh(2 * a);
    auto gamma =
        (k == 0) ? abs(gamma0) : (log(cosh_g + sqrt(cosh_g * cosh_g - 1)));
    if ((k & 1) == 1) {
      lp0 += (Lx * gamma / 2) + log(1 + exp(-(Lx * gamma)));
      lp1 += (Lx * gamma / 2) + log(1 - exp(-(Lx * gamma)));
    } else {
      lp2 += (Lx * gamma / 2) + log(1 + exp(-(Lx * gamma)));
      lp3 += (Lx * gamma / 2) + log(1 - exp(-(Lx * gamma)));
    }
  }
  auto logZ =
      -log(real_t(2)) / (Lx * Ly) + a + real_t(1) / 2 * log(1 - exp(-4 * a));
  if (gamma0 > 0) {
    logZ += (lp0 + log(1 + exp(lp1 - lp0) + exp(lp2 - lp0) - exp(lp3 - lp0))) /
            (Lx * Ly);
  } else if (gamma0 < 0) {
    logZ += (lp0 + log(1 + exp(lp1 - lp0) + exp(lp2 - lp0) + exp(lp3 - lp0))) /
            (Lx * Ly);
  } else {
    logZ += (lp0 + log(1 + exp(lp1 - lp0) + exp(lp2 - lp0))) / (Lx * Ly);
  }
  return -logZ / beta;
}